

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
GlassMaterial::sample
          (GlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *pfVar3;
  Vector2f *in_RCX;
  Texture *in_RDX;
  Vector3f *in_RDI;
  Vector3f *in_R8;
  undefined8 *in_R9;
  uint uVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  byte in_stack_00000008;
  Vector3f np;
  float r;
  float rp;
  float rs;
  float co2;
  float si2;
  float si;
  float t;
  float co;
  mt19937 *g;
  Vector3f *in_stack_fffffffffffffec8;
  Vector3f *in_stack_fffffffffffffed0;
  Vector3f *in_stack_fffffffffffffed8;
  mt19937 *in_stack_fffffffffffffee0;
  Vector3f *v0;
  Ray *in_stack_fffffffffffffee8;
  Ray *this_00;
  Vector3f *in_stack_fffffffffffffef0;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_44;
  undefined8 local_40;
  byte local_31;
  Vector3f *local_28;
  
  local_31 = in_stack_00000008 & 1;
  local_40 = *in_R9;
  local_28 = in_R8;
  ::operator-(in_stack_fffffffffffffed8);
  local_44 = Vector3f::dot((Vector3f *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_54 = in_RDI[0x13].m_elements[1];
  if (local_44 < 0.0) {
    local_44 = -local_44;
    local_54 = 0.0;
  }
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)-local_44),
                           SUB6416(ZEXT464(0x3f800000),0));
  local_5c = auVar1._0_4_;
  local_60 = 0.0;
  pfVar3 = std::max<float>(&local_5c,&local_60);
  local_58 = sqrtf(*pfVar3);
  fVar5 = local_58 * in_RDI[0x12].m_elements[0];
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)-fVar5),SUB6416(ZEXT464(0x3f800000),0)
                          );
  dVar7 = std::sqrt(auVar1._0_8_);
  uVar4 = SUB84(dVar7,0);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)in_RDI[0x12].m_elements[0]),
                           ZEXT416((uint)-local_44));
  auVar2 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)in_RDI[0x12].m_elements[0]),
                           ZEXT416((uint)local_44));
  fVar5 = auVar1._0_4_ / auVar2._0_4_;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)-in_RDI[0x12].m_elements[0]),
                           ZEXT416(uVar4));
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)in_RDI[0x12].m_elements[0]),
                           ZEXT416(uVar4));
  fVar6 = auVar1._0_4_ / auVar2._0_4_;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),ZEXT416((uint)(fVar6 * fVar6)))
  ;
  fVar5 = randf(in_stack_fffffffffffffee0);
  fVar6 = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  if (fVar5 <= auVar1._0_4_ / 2.0) {
    pfVar3 = in_RDI->m_elements + 2;
    Vector2f::Vector2f((Vector2f *)pfVar3,(Vector2f *)in_stack_fffffffffffffec8);
    Texture::get(in_RDX,in_RCX);
    ::operator*(in_RDI,in_stack_fffffffffffffef0);
    Vector3f::operator=((Vector3f *)pfVar3,in_stack_fffffffffffffec8);
    ::operator*(&in_stack_fffffffffffffee8->o,fVar6);
    v0 = (Vector3f *)((long)&in_RDX->source + 4);
    ::operator-(local_28);
    Vector3f::dot(v0,local_28);
    fVar5 = (float)((ulong)v0 >> 0x20);
    ::operator*(&in_stack_fffffffffffffee8->o,fVar5);
    ::operator+(in_RDI,in_stack_fffffffffffffef0);
    Vector3f::normalize((Vector3f *)pfVar3);
    Ray::pos(in_stack_fffffffffffffee8,fVar5);
    Vector3f::operator=((Vector3f *)pfVar3,in_stack_fffffffffffffec8);
    Vector3f::operator=((Vector3f *)pfVar3,in_stack_fffffffffffffec8);
  }
  else {
    this_00 = (Ray *)(in_RDI[9].m_elements + 1);
    Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffed0,(Vector2f *)in_stack_fffffffffffffec8);
    Texture::get(in_RDX,in_RCX);
    ::operator*(in_RDI,local_28);
    Vector3f::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Ray::pos(this_00,fVar6);
    Vector3f::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
		float t = thickness;
		if (co < 0) co = -co, t=0;
		float si = sqrtf(std::max(1 - co * co, float(0)));
		float si2 = si * refractCoef;
		float co2 = sqrt(1 - si2 * si2);
		float rs = (refractCoef * co2 - co) / (refractCoef * co2 + co);
		float rp = (co2 - refractCoef * co) / (co2 + refractCoef * co);
		float r = (rs * rs + rp * rp) / 2;
		//cerr << co << " " << r << "\n";
//		r = 0.25 + 0.5 * r;
		//Vector3f i1=ray.d, i2;
		if (randf(g) > r) {
			coe = coe * refractColor.get(hit.pos);
			ray.o = ray.pos(hit.t+ t);
		}
		else {
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np;
		}
		/*
		i2 = ray.d;
		if (Vector3f::dot(i1, -hit.norm) < 0) i1 = -i1;
		if (Vector3f::dot(i2, hit.norm) < 0) i2 = -i2;
		Vector3f b=m->BRDF(i1, i2, hit);*/
		/*
		if (b[0] > 2) b[0] = 2;
		if (b[1] > 2) b[1] = 2;
		if (b[2] > 2) b[2] = 2;*/
		//coe = coe * b; //not actually physical but could work
		return 1;
	}